

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_steal_queue.h
# Opt level: O2

circular_array * __thiscall
async::detail::work_steal_queue::circular_array::grow(circular_array *this,size_t top,size_t bottom)

{
  size_t sVar1;
  circular_array *this_00;
  size_t i;
  
  this_00 = (circular_array *)operator_new(0x18);
  circular_array(this_00,(this->items).length * 2);
  std::
  __uniq_ptr_impl<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
  ::reset((__uniq_ptr_impl<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
           *)&this_00->previous,this);
  sVar1 = (this->items).length;
  for (; bottom != top; top = top + 1) {
    (this_00->items).ptr[(this_00->items).length - 1 & top] = (this->items).ptr[sVar1 - 1 & top];
  }
  return this_00;
}

Assistant:

circular_array* grow(std::size_t top, std::size_t bottom)
		{
			circular_array* new_array = new circular_array(size() * 2);
			new_array->previous.reset(this);
			for (std::size_t i = top; i != bottom; i++)
				new_array->put(i, get(i));
			return new_array;
		}